

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid_lib.cc
# Opt level: O1

void EnumerateGrids(size_t first_grid_idx,size_t count,void *index,void *table,
                   _func_void_char_ptr *callback)

{
  ushort uVar1;
  int iVar2;
  ulong uVar3;
  ulong limit;
  size_t remaining;
  anon_class_24_3_8aa9199d skipping_callback;
  char pattern [82];
  ulong local_b8;
  size_t local_b0;
  _func_void_char_ptr *local_a8;
  undefined1 *local_a0;
  _func_void_char_ptr **local_98;
  size_t *local_90;
  char local_88 [88];
  
  uVar3 = (ulong)*(uint *)((long)index + (first_grid_idx >> 0x14) * 6);
  local_b8 = (ulong)((uint)first_grid_idx & 0xfffff) +
             (ulong)*(ushort *)((long)index + (first_grid_idx >> 0x14) * 6 + 4);
  uVar1 = *(ushort *)((long)table + uVar3 * 2);
  while (uVar1 <= local_b8) {
    local_b8 = local_b8 - uVar1;
    uVar3 = (ulong)((int)uVar3 + 1);
    uVar1 = *(ushort *)((long)table + uVar3 * 2);
  }
  if (count != 0) {
    local_b0 = count;
    local_a8 = callback;
    do {
      limit = local_b0 + local_b8;
      if ((ulong)uVar1 <= local_b0 + local_b8) {
        limit = (ulong)uVar1;
      }
      builtin_strncpy(local_88 + 0x40,".................",0x11);
      builtin_strncpy(local_88,"123......456......789...........................................",
                      0x40);
      iVar2 = (int)uVar3;
      anon_unknown.dwarf_73c8::BandInit
                (iVar2 % 0x8dc0,anon_unknown.dwarf_73c8::HorizIndexing,local_88);
      anon_unknown.dwarf_73c8::BandInit
                (iVar2 / 0x8dc0,anon_unknown.dwarf_73c8::VertiIndexing,local_88);
      local_88[0x51] = 0;
      local_98 = &local_a8;
      local_90 = &local_b0;
      local_a0 = (undefined1 *)&local_b8;
      TdokuEnumerate(local_88,limit,EnumerateGrids::anon_class_1_0_00000001::__invoke,&local_a0);
      uVar3 = (ulong)(iVar2 + 1);
      uVar1 = *(ushort *)((long)table + uVar3 * 2);
    } while (local_b0 != 0);
  }
  return;
}

Assistant:

void EnumerateGrids(size_t first_grid_idx, size_t count,
                    const void *index, const void *table,
                    void (*callback)(const char *)) {
    size_t indexed_grid_idx = first_grid_idx & ~((1ull << 20u) - 1);
    uint32_t current_pattern_idx = *(uint32_t *)(((char *)index) + (first_grid_idx >> 20u)* 6);
    uint16_t indexed_grid_offset = *(uint16_t *)(((char *)index) + (first_grid_idx  >> 20u)* 6 + 4);

    size_t to_skip = indexed_grid_offset + (first_grid_idx  - indexed_grid_idx);
    uint16_t pattern_count = *(((uint16_t *) table) + current_pattern_idx);
    while (to_skip >= pattern_count) {
        to_skip -= pattern_count;
        current_pattern_idx++;
        pattern_count = *(((uint16_t *) table) + current_pattern_idx);
    }
    size_t remaining = count;
    while (remaining > 0) {
        size_t limit = to_skip + remaining;
        if (limit > pattern_count) limit = pattern_count;

        char pattern[82];
        GetPattern(current_pattern_idx, pattern);

        auto skipping_callback=[&](const char *grid){
            if (to_skip > 0) {
                to_skip--;
            } else {
                callback(grid);
                remaining--;
            }
        };
        // pass a thunk since we can't pass a capturing lambda as a function pointer
        TdokuEnumerate(pattern, limit, [](const char *grid, void *thunked_callback) {
            (*static_cast<decltype(skipping_callback)*>(thunked_callback))(grid);
        }, &skipping_callback);

        current_pattern_idx++;
        pattern_count = *(((uint16_t *) table) + current_pattern_idx);
    }
}